

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O3

void scp::_scp::cooleyTukeyRadix2<std::complex<double>>
               (complex<double> *beg,uint64_t stride,complex<double> *base,uint64_t baseStride,
               uint64_t size)

{
  complex<double> *beg_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  complex<double> *x0;
  ulong size_00;
  double local_48;
  double dStack_40;
  uint64_t local_38;
  
  if (size == 2) {
    dVar4 = *(double *)beg->_M_value;
    dVar3 = *(double *)(beg->_M_value + 8);
    local_48 = *(double *)base->_M_value;
    dStack_40 = *(double *)(base->_M_value + 8);
    std::complex<double>::operator*=((complex<double> *)&local_48,beg + stride);
    dStack_40 = *(double *)(beg->_M_value + 8) + dStack_40;
    auVar1._8_4_ = SUB84(dStack_40,0);
    auVar1._0_8_ = *(double *)beg->_M_value + local_48;
    auVar1._12_4_ = (int)((ulong)dStack_40 >> 0x20);
    *(undefined1 (*) [16])beg->_M_value = auVar1;
    local_48 = *(double *)base[baseStride]._M_value;
    dStack_40 = *(double *)(base[baseStride]._M_value + 8);
    std::complex<double>::operator*=((complex<double> *)&local_48,beg + stride);
    dVar3 = dVar3 + dStack_40;
    auVar2._8_4_ = SUB84(dVar3,0);
    auVar2._0_8_ = dVar4 + local_48;
    auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
    *(undefined1 (*) [16])beg[stride]._M_value = auVar2;
  }
  else {
    size_00 = size >> 1;
    local_38 = baseStride * 2;
    cooleyTukeyRadix2<std::complex<double>>(beg,stride,base,local_38,size_00);
    lVar5 = size_00 * stride;
    beg_00 = beg + lVar5;
    cooleyTukeyRadix2<std::complex<double>>(beg_00,stride,base,local_38,size_00);
    if (lVar5 != 0) {
      lVar6 = 0;
      do {
        local_48 = *(double *)base->_M_value;
        dStack_40 = *(double *)(base->_M_value + 8);
        std::complex<double>::operator*=
                  ((complex<double> *)&local_48,(complex<double> *)(beg_00->_M_value + lVar6));
        dVar3 = *(double *)((long)(beg->_M_value + lVar6) + 8);
        *(double *)(beg_00->_M_value + lVar6) = *(double *)(beg->_M_value + lVar6) - local_48;
        *(double *)((long)(beg_00->_M_value + lVar6) + 8) = dVar3 - dStack_40;
        dVar3 = *(double *)((long)(beg->_M_value + lVar6) + 8);
        *(double *)(beg->_M_value + lVar6) = *(double *)(beg->_M_value + lVar6) + local_48;
        *(double *)((long)(beg->_M_value + lVar6) + 8) = dVar3 + dStack_40;
        base = base + baseStride;
        lVar6 = lVar6 + stride * 0x10;
      } while (lVar5 * 0x10 != lVar6);
    }
  }
  return;
}

Assistant:

constexpr void cooleyTukeyRadix2(TValue* beg, uint64_t stride, const TValue* base, uint64_t baseStride, uint64_t size)
		{
			if (size == 2)
			{
				TValue& x0 = *beg;
				TValue& x1 = *(beg + stride);
				const TValue tmp = x0;
				x0 += *base * x1;
				x1 = tmp + *(base + baseStride) * x1;
			}
			else
			{
				size >>= 1;
				baseStride <<= 1;

				cooleyTukeyRadix2(beg, stride, base, baseStride, size);
				cooleyTukeyRadix2(beg + size * stride, stride, base, baseStride, size);

				baseStride >>= 1;

				TValue* it = beg;
				TValue* it2 = it + size * stride;
				const TValue* const itEnd = it2;
				for (; it != itEnd; it += stride, it2 += stride, base += baseStride)
				{
					TValue tmp = *base * *it2;
					*it2 = *it - tmp;
					*it += tmp;
				}
			}
		}